

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_IntPrecision_Test::TestBody(PrintfTest_IntPrecision_Test *this)

{
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  string_view format_12;
  string_view format_13;
  string_view format_14;
  string_view format_15;
  string_view format_16;
  string_view format_17;
  string_view format_18;
  string_view format_19;
  string_view format_20;
  string_view format_21;
  string_view format_22;
  string_view format_23;
  string_view format_24;
  string_view format_25;
  string_view format_26;
  string_view format_27;
  string_view format_28;
  string_view format_29;
  string_view format_30;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char (*in_stack_ffffffffffffeee8) [9];
  undefined7 in_stack_ffffffffffffeef0;
  undefined1 in_stack_ffffffffffffeef7;
  char (*in_stack_ffffffffffffeef8) [11];
  string *expected;
  char *in_stack_ffffffffffffef00;
  Message *in_stack_ffffffffffffef08;
  int line;
  Message *in_stack_ffffffffffffef10;
  Type in_stack_ffffffffffffef1c;
  Type type;
  AssertHelper *in_stack_ffffffffffffef20;
  AssertHelper *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef28;
  undefined7 in_stack_ffffffffffffef30;
  undefined1 in_stack_ffffffffffffef37;
  size_t in_stack_ffffffffffffef38;
  string *psVar4;
  Message *in_stack_ffffffffffffef68;
  undefined7 in_stack_ffffffffffffef70;
  undefined1 in_stack_ffffffffffffef77;
  string local_cf0 [32];
  string local_cd0 [32];
  AssertionResult local_cb0 [2];
  undefined4 local_c8c;
  AssertHelper local_c78 [4];
  AssertionResult local_c58 [2];
  undefined4 local_c34;
  string local_c20 [32];
  string local_c00 [32];
  AssertionResult local_be0 [2];
  undefined4 local_bbc;
  string local_ba8 [32];
  AssertionResult local_b88 [2];
  undefined4 local_b64;
  string local_b50 [32];
  string local_b30 [32];
  AssertionResult local_b10 [2];
  undefined4 local_aec;
  string local_ad8 [32];
  AssertionResult local_ab8 [2];
  undefined4 local_a94;
  string local_a80 [32];
  string local_a60 [32];
  AssertionResult local_a40 [2];
  undefined4 local_a1c;
  string local_a08 [32];
  AssertionResult local_9e8 [2];
  undefined4 local_9c4;
  string local_9b0 [32];
  string local_990 [32];
  AssertionResult local_970 [2];
  undefined4 local_94c;
  string local_938 [32];
  AssertionResult local_918 [2];
  undefined4 local_8f4;
  string local_8e0 [32];
  string local_8c0 [32];
  AssertionResult local_8a0 [2];
  undefined4 local_87c;
  string local_868 [32];
  AssertionResult local_848 [2];
  undefined4 local_824;
  string local_810 [32];
  string local_7f0 [32];
  AssertionResult local_7d0 [2];
  undefined4 local_7ac;
  string local_798 [32];
  AssertionResult local_778 [2];
  undefined4 local_754;
  string local_740 [32];
  string local_720 [32];
  AssertionResult local_700 [2];
  undefined4 local_6dc;
  string local_6c8 [32];
  AssertionResult local_6a8 [2];
  undefined4 local_684;
  string local_670 [32];
  string local_650 [32];
  AssertionResult local_630 [2];
  undefined4 local_60c;
  string local_5f8 [32];
  AssertionResult local_5d8 [2];
  undefined4 local_5b4;
  string local_5a0 [32];
  string local_580 [32];
  AssertionResult local_560 [2];
  undefined4 local_53c;
  string local_528 [32];
  AssertionResult local_508 [2];
  undefined4 local_4e4;
  string local_4d0 [32];
  string local_4b0 [32];
  AssertionResult local_490 [2];
  undefined4 local_46c;
  string local_458 [32];
  AssertionResult local_438 [2];
  undefined4 local_414;
  string local_400 [32];
  string local_3e0 [32];
  AssertionResult local_3c0 [2];
  undefined4 local_39c;
  string local_388 [32];
  AssertionResult local_368 [2];
  undefined4 local_344;
  string local_330 [32];
  string local_310 [32];
  AssertionResult local_2f0 [2];
  undefined4 local_2cc;
  string local_2b8 [32];
  AssertionResult local_298 [2];
  undefined4 local_274;
  string local_260 [32];
  string local_240 [32];
  AssertionResult local_220 [2];
  undefined4 local_1fc;
  string local_1e8 [32];
  AssertionResult local_1c8 [2];
  undefined4 local_1a4;
  string local_190 [32];
  string local_170 [32];
  AssertionResult local_150 [2];
  undefined4 local_12c;
  string local_118 [32];
  AssertionResult local_f8 [2];
  undefined4 local_d4;
  string local_c0 [32];
  string local_a0 [32];
  AssertionResult local_80 [3];
  undefined4 local_4c;
  string local_38 [32];
  AssertionResult local_18;
  
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_4c = 0x2a;
  format.data_._7_1_ = in_stack_ffffffffffffeef7;
  format.data_._0_7_ = in_stack_ffffffffffffeef0;
  format.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [6])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               (char (*) [5])in_stack_ffffffffffffeee8);
    testing::AssertionResult::failure_message((AssertionResult *)0x124b03);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x124b66);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124bbe);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  format_15.data_._7_1_ = in_stack_ffffffffffffef37;
  format_15.data_._0_7_ = in_stack_ffffffffffffef30;
  format_15.size_ = in_stack_ffffffffffffef38;
  make_positional_abi_cxx11_(format_15);
  local_d4 = 0x2a;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [6])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_80);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::AssertionResult::failure_message((AssertionResult *)0x124d1f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x124d82);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124dda);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_12c = 0xffffffd6;
  format_00.data_._7_1_ = in_stack_ffffffffffffeef7;
  format_00.data_._0_7_ = in_stack_ffffffffffffeef0;
  format_00.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format_00,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [7])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               (char (*) [5])in_stack_ffffffffffffeee8);
    testing::AssertionResult::failure_message((AssertionResult *)0x124f30);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x124f93);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124feb);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  format_16.data_._7_1_ = in_stack_ffffffffffffef37;
  format_16.data_._0_7_ = in_stack_ffffffffffffef30;
  format_16.size_ = in_stack_ffffffffffffef38;
  make_positional_abi_cxx11_(format_16);
  local_1a4 = 0xffffffd6;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [7])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::AssertionResult::failure_message((AssertionResult *)0x12514c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x1251af);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125207);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_1fc = 0x42;
  format_01.data_._7_1_ = in_stack_ffffffffffffeef7;
  format_01.data_._0_7_ = in_stack_ffffffffffffeef0;
  format_01.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format_01,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [6])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               (char (*) [5])in_stack_ffffffffffffeee8);
    testing::AssertionResult::failure_message((AssertionResult *)0x12535d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x1253c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125418);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  format_17.data_._7_1_ = in_stack_ffffffffffffef37;
  format_17.data_._0_7_ = in_stack_ffffffffffffef30;
  format_17.size_ = in_stack_ffffffffffffef38;
  make_positional_abi_cxx11_(format_17);
  local_274 = 0x42;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [6])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_220);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::AssertionResult::failure_message((AssertionResult *)0x125579);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x1255dc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125634);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_2cc = 0x42;
  format_02.data_._7_1_ = in_stack_ffffffffffffeef7;
  format_02.data_._0_7_ = in_stack_ffffffffffffeef0;
  format_02.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format_02,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [8])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_2b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_298);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               (char (*) [6])in_stack_ffffffffffffeee8);
    testing::AssertionResult::failure_message((AssertionResult *)0x12578a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x1257ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125845);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  format_18.data_._7_1_ = in_stack_ffffffffffffef37;
  format_18.data_._0_7_ = in_stack_ffffffffffffef30;
  format_18.size_ = in_stack_ffffffffffffef38;
  make_positional_abi_cxx11_(format_18);
  local_344 = 0x42;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [8])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_310);
  std::__cxx11::string::~string(local_330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::AssertionResult::failure_message((AssertionResult *)0x1259a6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x125a09);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125a61);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_39c = 0x22;
  format_03.data_._7_1_ = in_stack_ffffffffffffeef7;
  format_03.data_._0_7_ = in_stack_ffffffffffffeef0;
  format_03.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format_03,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [6])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_388);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_368);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               (char (*) [5])in_stack_ffffffffffffeee8);
    testing::AssertionResult::failure_message((AssertionResult *)0x125bb7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x125c1a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125c72);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  format_19.data_._7_1_ = in_stack_ffffffffffffef37;
  format_19.data_._0_7_ = in_stack_ffffffffffffef30;
  format_19.size_ = in_stack_ffffffffffffef38;
  make_positional_abi_cxx11_(format_19);
  local_414 = 0x22;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [6])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::~string(local_400);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::AssertionResult::failure_message((AssertionResult *)0x125dd3);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x125e36);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125e8e);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_46c = 0x22;
  format_04.data_._7_1_ = in_stack_ffffffffffffeef7;
  format_04.data_._0_7_ = in_stack_ffffffffffffeef0;
  format_04.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format_04,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [6])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_438);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               (char (*) [6])in_stack_ffffffffffffeee8);
    testing::AssertionResult::failure_message((AssertionResult *)0x125fe4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x126047);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12609f);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  format_20.data_._7_1_ = in_stack_ffffffffffffef37;
  format_20.data_._0_7_ = in_stack_ffffffffffffef30;
  format_20.size_ = in_stack_ffffffffffffef38;
  make_positional_abi_cxx11_(format_20);
  local_4e4 = 0x22;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [6])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_4b0);
  std::__cxx11::string::~string(local_4d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_490);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::AssertionResult::failure_message((AssertionResult *)0x126200);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x126263);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1262bb);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_53c = 0x2a;
  format_05.data_._7_1_ = in_stack_ffffffffffffeef7;
  format_05.data_._0_7_ = in_stack_ffffffffffffeef0;
  format_05.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format_05,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [8])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_528);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_508);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               (char (*) [6])in_stack_ffffffffffffeee8);
    testing::AssertionResult::failure_message((AssertionResult *)0x126411);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x126474);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1264cc);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  format_21.data_._7_1_ = in_stack_ffffffffffffef37;
  format_21.data_._0_7_ = in_stack_ffffffffffffef30;
  format_21.size_ = in_stack_ffffffffffffef38;
  make_positional_abi_cxx11_(format_21);
  local_5b4 = 0x2a;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [8])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_580);
  std::__cxx11::string::~string(local_5a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_560);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::AssertionResult::failure_message((AssertionResult *)0x12662d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x126690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1266e8);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_60c = 0x42;
  format_06.data_._7_1_ = in_stack_ffffffffffffeef7;
  format_06.data_._0_7_ = in_stack_ffffffffffffeef0;
  format_06.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format_06,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [8])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_5f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               (char (*) [6])in_stack_ffffffffffffeee8);
    testing::AssertionResult::failure_message((AssertionResult *)0x12683e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x1268a1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1268f9);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  format_22.data_._7_1_ = in_stack_ffffffffffffef37;
  format_22.data_._0_7_ = in_stack_ffffffffffffef30;
  format_22.size_ = in_stack_ffffffffffffef38;
  make_positional_abi_cxx11_(format_22);
  local_684 = 0x42;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [8])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_650);
  std::__cxx11::string::~string(local_670);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_630);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::AssertionResult::failure_message((AssertionResult *)0x126a5a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x126abd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x126b15);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_6dc = 0x42;
  format_07.data_._7_1_ = in_stack_ffffffffffffeef7;
  format_07.data_._0_7_ = in_stack_ffffffffffffeef0;
  format_07.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format_07,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_6c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               (char (*) [8])in_stack_ffffffffffffeee8);
    testing::AssertionResult::failure_message((AssertionResult *)0x126c6b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x126cce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x126d26);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  format_23.data_._7_1_ = in_stack_ffffffffffffef37;
  format_23.data_._0_7_ = in_stack_ffffffffffffef30;
  format_23.size_ = in_stack_ffffffffffffef38;
  make_positional_abi_cxx11_(format_23);
  local_754 = 0x42;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_720);
  std::__cxx11::string::~string(local_740);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_700);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::AssertionResult::failure_message((AssertionResult *)0x126e87);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x126eea);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x126f42);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_7ac = 0x22;
  format_08.data_._7_1_ = in_stack_ffffffffffffeef7;
  format_08.data_._0_7_ = in_stack_ffffffffffffeef0;
  format_08.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format_08,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [8])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_798);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_778);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               (char (*) [6])in_stack_ffffffffffffeee8);
    testing::AssertionResult::failure_message((AssertionResult *)0x127098);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x1270fb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127153);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  format_24.data_._7_1_ = in_stack_ffffffffffffef37;
  format_24.data_._0_7_ = in_stack_ffffffffffffef30;
  format_24.size_ = in_stack_ffffffffffffef38;
  make_positional_abi_cxx11_(format_24);
  local_824 = 0x22;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [8])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_7f0);
  std::__cxx11::string::~string(local_810);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::AssertionResult::failure_message((AssertionResult *)0x1272b4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x127317);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12736f);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_87c = 0x22;
  format_09.data_._7_1_ = in_stack_ffffffffffffeef7;
  format_09.data_._0_7_ = in_stack_ffffffffffffeef0;
  format_09.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format_09,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_868);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_848);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               (char (*) [8])in_stack_ffffffffffffeee8);
    testing::AssertionResult::failure_message((AssertionResult *)0x1274c5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x127528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127580);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  format_25.data_._7_1_ = in_stack_ffffffffffffef37;
  format_25.data_._0_7_ = in_stack_ffffffffffffef30;
  format_25.size_ = in_stack_ffffffffffffef38;
  make_positional_abi_cxx11_(format_25);
  local_8f4 = 0x22;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_8c0);
  std::__cxx11::string::~string(local_8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::AssertionResult::failure_message((AssertionResult *)0x1276e1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x127744);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12779c);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_94c = 0x2a;
  format_10.data_._7_1_ = in_stack_ffffffffffffeef7;
  format_10.data_._0_7_ = in_stack_ffffffffffffeef0;
  format_10.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format_10,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [8])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_938);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_918);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               (char (*) [7])in_stack_ffffffffffffeee8);
    testing::AssertionResult::failure_message((AssertionResult *)0x1278f2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x127955);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1279ad);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  format_26.data_._7_1_ = in_stack_ffffffffffffef37;
  format_26.data_._0_7_ = in_stack_ffffffffffffef30;
  format_26.size_ = in_stack_ffffffffffffef38;
  make_positional_abi_cxx11_(format_26);
  local_9c4 = 0x2a;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [8])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_990);
  std::__cxx11::string::~string(local_9b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_970);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::AssertionResult::failure_message((AssertionResult *)0x127b0e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x127b71);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127bc9);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_a1c = 0x42;
  format_11.data_._7_1_ = in_stack_ffffffffffffeef7;
  format_11.data_._0_7_ = in_stack_ffffffffffffeef0;
  format_11.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format_11,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [8])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_a08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_9e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               (char (*) [7])in_stack_ffffffffffffeee8);
    testing::AssertionResult::failure_message((AssertionResult *)0x127d1f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x127d82);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127dda);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  format_27.data_._7_1_ = in_stack_ffffffffffffef37;
  format_27.data_._0_7_ = in_stack_ffffffffffffef30;
  format_27.size_ = in_stack_ffffffffffffef38;
  make_positional_abi_cxx11_(format_27);
  local_a94 = 0x42;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [8])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_a60);
  std::__cxx11::string::~string(local_a80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a40);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::AssertionResult::failure_message((AssertionResult *)0x127f3b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x127f9e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127ff6);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_aec = 0x42;
  format_12.data_._7_1_ = in_stack_ffffffffffffeef7;
  format_12.data_._0_7_ = in_stack_ffffffffffffeef0;
  format_12.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format_12,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_ad8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_ab8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::AssertionResult::failure_message((AssertionResult *)0x12814c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
               in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x1281af);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128207);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  format_28.data_._7_1_ = in_stack_ffffffffffffef37;
  format_28.data_._0_7_ = in_stack_ffffffffffffef30;
  format_28.size_ = in_stack_ffffffffffffef38;
  make_positional_abi_cxx11_(format_28);
  local_b64 = 0x42;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_b30);
  std::__cxx11::string::~string(local_b50);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_b10);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    in_stack_ffffffffffffef68 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x128368);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffef70),in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x1283cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128423);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_bbc = 0x22;
  format_13.data_._7_1_ = in_stack_ffffffffffffeef7;
  format_13.data_._0_7_ = in_stack_ffffffffffffeef0;
  format_13.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format_13,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [8])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_ba8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               in_stack_ffffffffffffeee8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
               (char (*) [7])in_stack_ffffffffffffeee8);
    testing::AssertionResult::failure_message((AssertionResult *)0x128564);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffef70),in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x1285be);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128616);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  psVar4 = local_c20;
  format_29.data_._7_1_ = in_stack_ffffffffffffef37;
  format_29.data_._0_7_ = in_stack_ffffffffffffef30;
  format_29.size_ = (size_t)psVar4;
  make_positional_abi_cxx11_(format_29);
  local_c34 = 0x22;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
             (char (*) [8])in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string(local_c00);
  std::__cxx11::string::~string(local_c20);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_be0);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef20);
    in_stack_ffffffffffffef28 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x12876b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c,(char *)in_stack_ffffffffffffef10
               ,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffef70),in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x1287c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128820);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  local_c8c = 0x22;
  this_00 = local_c78;
  format_14.data_._7_1_ = in_stack_ffffffffffffeef7;
  format_14.data_._0_7_ = in_stack_ffffffffffffeef0;
  format_14.size_ = (size_t)in_stack_ffffffffffffeef8;
  test_sprintf<int>(format_14,(int *)in_stack_ffffffffffffeee8);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  std::__cxx11::string::~string((string *)local_c78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c58);
  type = CONCAT13(bVar1,(int3)in_stack_ffffffffffffef1c);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_ffffffffffffef10 =
         testing::Message::operator<<
                   ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
                    in_stack_ffffffffffffeee8);
    in_stack_ffffffffffffef08 =
         testing::Message::operator<<
                   ((Message *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
                    in_stack_ffffffffffffeee8);
    in_stack_ffffffffffffef00 =
         testing::AssertionResult::failure_message((AssertionResult *)0x128961);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_ffffffffffffef10,
               (int)((ulong)in_stack_ffffffffffffef08 >> 0x20),in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffef70),in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x1289bb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128a13);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
             *in_stack_ffffffffffffeee8);
  expected = local_cf0;
  format_30.data_._7_1_ = uVar3;
  format_30.data_._0_7_ = in_stack_ffffffffffffef30;
  format_30.size_ = (size_t)psVar4;
  make_positional_abi_cxx11_(format_30);
  fmt::v5::sprintf<std::__cxx11::string,int>(in_stack_ffffffffffffef28,(int *)this_00);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,(char (*) [11])expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
  line = (int)((ulong)in_stack_ffffffffffffef08 >> 0x20);
  std::__cxx11::string::~string(local_cd0);
  std::__cxx11::string::~string(local_cf0);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_cb0);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x128b68);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_ffffffffffffef10,line,in_stack_ffffffffffffef00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffef70),in_stack_ffffffffffffef68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_ffffffffffffeef0));
    testing::Message::~Message((Message *)0x128bc3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128c18);
  return;
}

Assistant:

TEST(PrintfTest, IntPrecision) {
  EXPECT_PRINTF("00042", "%.5d", 42);
  EXPECT_PRINTF("-00042", "%.5d", -42);
  EXPECT_PRINTF("00042", "%.5x", 0x42);
  EXPECT_PRINTF("0x00042", "%#.5x", 0x42);
  EXPECT_PRINTF("00042", "%.5o", 042);
  EXPECT_PRINTF("00042", "%#.5o", 042);

  EXPECT_PRINTF("  00042", "%7.5d", 42);
  EXPECT_PRINTF("  00042", "%7.5x", 0x42);
  EXPECT_PRINTF("   0x00042", "%#10.5x", 0x42);
  EXPECT_PRINTF("  00042", "%7.5o", 042);
  EXPECT_PRINTF("     00042", "%#10.5o", 042);

  EXPECT_PRINTF("00042  ", "%-7.5d", 42);
  EXPECT_PRINTF("00042  ", "%-7.5x", 0x42);
  EXPECT_PRINTF("0x00042   ", "%-#10.5x", 0x42);
  EXPECT_PRINTF("00042  ", "%-7.5o", 042);
  EXPECT_PRINTF("00042     ", "%-#10.5o", 042);
}